

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::intersectsPolygon(Earcut<unsigned_int> *this,Node *a,Node *b)

{
  bool bVar1;
  Node *local_30;
  Node *p;
  Node *b_local;
  Node *a_local;
  Earcut<unsigned_int> *this_local;
  
  local_30 = a;
  while ((((local_30->i == a->i || (local_30->next->i == a->i)) || (local_30->i == b->i)) ||
         ((local_30->next->i == b->i ||
          (bVar1 = intersects(this,local_30,local_30->next,a,b), !bVar1))))) {
    local_30 = local_30->next;
    if (local_30 == a) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Earcut<N>::intersectsPolygon(const Node* a, const Node* b) {
    const Node* p = a;
    do {
        if (p->i != a->i && p->next->i != a->i && p->i != b->i && p->next->i != b->i &&
                intersects(p, p->next, a, b)) return true;
        p = p->next;
    } while (p != a);

    return false;
}